

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

MPP_RET mpp_buffer_group_reset(MppBufferGroupImpl *p)

{
  list_head *plVar1;
  int iVar2;
  list_head **local_38;
  MppBufferImpl *n_1;
  MppBufferImpl *pos_1;
  MppBufferImpl *n;
  MppBufferImpl *pos;
  MppBufferGroupImpl *p_local;
  
  if (p == (MppBufferGroupImpl *)0x0) {
    _mpp_log_l(2,"mpp_buffer","found NULL pointer\n","mpp_buffer_group_reset");
    p_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    if ((mpp_buffer_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_group_reset");
    }
    pthread_mutex_lock((pthread_mutex_t *)&p->buf_lock);
    buf_grp_add_log(p,GRP_RESET,(char *)0x0);
    iVar2 = list_empty(&p->list_used);
    if (iVar2 == 0) {
      plVar1 = (p->list_used).next;
      n = (MppBufferImpl *)&plVar1[-0xd].prev;
      plVar1 = plVar1->next;
      while (pos_1 = (MppBufferImpl *)&plVar1[-0xd].prev, &n->list_status != &p->list_used) {
        buf_add_log(n,BUF_DISCARD,(char *)0x0);
        n->discard = 1;
        n = pos_1;
        plVar1 = plVar1->next;
      }
    }
    iVar2 = list_empty(&p->list_unused);
    if (iVar2 == 0) {
      plVar1 = (p->list_unused).next;
      n_1 = (MppBufferImpl *)&plVar1[-0xd].prev;
      plVar1 = plVar1->next;
      while (local_38 = &plVar1[-0xd].prev, &n_1->list_status != &p->list_unused) {
        put_buffer(p,n_1,0,"mpp_buffer_group_reset");
        n_1 = (MppBufferImpl *)local_38;
        plVar1 = plVar1->next;
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)&p->buf_lock);
    if ((mpp_buffer_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_group_reset");
    }
    p_local._4_4_ = MPP_OK;
  }
  return p_local._4_4_;
}

Assistant:

MPP_RET mpp_buffer_group_reset(MppBufferGroupImpl *p)
{
    if (NULL == p) {
        mpp_err_f("found NULL pointer\n");
        return MPP_ERR_NULL_PTR;
    }

    MPP_BUF_FUNCTION_ENTER();

    pthread_mutex_lock(&p->buf_lock);

    buf_grp_add_log(p, GRP_RESET, NULL);

    if (!list_empty(&p->list_used)) {
        MppBufferImpl *pos, *n;

        list_for_each_entry_safe(pos, n, &p->list_used, MppBufferImpl, list_status) {
            buf_add_log(pos, BUF_DISCARD, NULL);
            pos->discard = 1;
        }
    }

    // remove unused list
    if (!list_empty(&p->list_unused)) {
        MppBufferImpl *pos, *n;
        list_for_each_entry_safe(pos, n, &p->list_unused, MppBufferImpl, list_status) {
            put_buffer(p, pos, 0, __FUNCTION__);
        }
    }

    pthread_mutex_unlock(&p->buf_lock);

    MPP_BUF_FUNCTION_LEAVE();
    return MPP_OK;
}